

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

QByteArray *
QUtf8::convertFromUnicode(QByteArray *__return_storage_ptr__,QStringView in,State *state)

{
  Data *pDVar1;
  char *pcVar2;
  __off_t extraout_RDX_00;
  __off_t __length;
  State *in_R8;
  QStringView in_00;
  __off_t extraout_RDX;
  
  in_00.m_data = (storage_type_conflict *)in.m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(long)in_00.m_data * 3 + 3,Uninitialized);
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  in_00.m_size = (qsizetype)state;
  pcVar2 = convertFromUnicode((QUtf8 *)(__return_storage_ptr__->d).ptr,(char *)in.m_data,in_00,in_R8
                             );
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (__length = extraout_RDX,
     1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
    __length = extraout_RDX_00;
  }
  QByteArray::truncate
            (__return_storage_ptr__,pcVar2 + -(long)(__return_storage_ptr__->d).ptr,__length);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QUtf8::convertFromUnicode(QStringView in, QStringConverter::State *state)
{
    QByteArray ba(3*in.size() +3, Qt::Uninitialized);
    char *end = convertFromUnicode(ba.data(), in, state);
    ba.truncate(end - ba.data());
    return ba;
}